

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

bool FinalizePSBT(PartiallySignedTransaction *psbtx)

{
  long lVar1;
  SigningProvider *provider;
  bool bVar2;
  bool bVar3;
  uint i;
  ulong uVar4;
  long in_FS_OFFSET;
  PrecomputedTransactionData txdata;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PrecomputePSBTData(&txdata,psbtx);
  provider = DUMMY_SIGNING_PROVIDER;
  bVar3 = true;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)*(pointer *)
                              ((long)&(psbtx->tx).
                                      super__Optional_base<CMutableTransaction,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                      .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                      _M_value.vin + 8) -
                      *(long *)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                                _M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin) / 0x68); uVar4 = (ulong)((int)uVar4 + 1)) {
    bVar2 = SignPSBTInput(provider,psbtx,(int)uVar4,&txdata,1,(SignatureData *)0x0,true);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool FinalizePSBT(PartiallySignedTransaction& psbtx)
{
    // Finalize input signatures -- in case we have partial signatures that add up to a complete
    //   signature, but have not combined them yet (e.g. because the combiner that created this
    //   PartiallySignedTransaction did not understand them), this will combine them into a final
    //   script.
    bool complete = true;
    const PrecomputedTransactionData txdata = PrecomputePSBTData(psbtx);
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        complete &= SignPSBTInput(DUMMY_SIGNING_PROVIDER, psbtx, i, &txdata, SIGHASH_ALL, nullptr, true);
    }

    return complete;
}